

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::getFilterTypesInterlaced
               (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *filterTypes,vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  const_reference pvVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  size_type sVar5;
  reference in;
  size_t sVar6;
  size_type sVar7;
  value_type_conflict1 *__x;
  value_type_conflict1 *pvVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_RDI;
  size_t i_2;
  size_t linebytes_1;
  uint h2;
  uint w2;
  size_t j;
  size_t pos;
  size_t i_1;
  size_t linebytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint i;
  uint clength;
  uchar *cdata;
  char type [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> zdata;
  uchar *next;
  uchar *end;
  uchar *begin;
  uchar *chunk;
  uint error;
  uint h;
  uint w;
  State state;
  LodePNGColorMode *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  value_type_conflict1 *in_stack_fffffffffffffc38;
  State *in_stack_fffffffffffffc40;
  LodePNGState *in_stack_fffffffffffffc48;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffc50;
  uint *in_stack_fffffffffffffc58;
  LodePNGDecompressSettings *settings;
  allocator<char> *in_stack_fffffffffffffc60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *insize;
  char *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  ulong local_328;
  uint local_318;
  ulong local_310;
  value_type_conflict1 *local_308;
  size_type local_300;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2f0;
  uint local_2d8;
  uint local_2d4;
  uchar *local_2d0;
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [35];
  char local_275 [5];
  LodePNGDecompressSettings local_270;
  const_reference local_250;
  const_reference local_248;
  const_reference local_240;
  undefined4 local_238;
  uint local_224;
  uint local_220;
  int local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_10;
  uint local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  State::State(in_stack_fffffffffffffc40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_18,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
  local_224 = lodepng_inspect(in_stack_fffffffffffffc58,(uint *)in_stack_fffffffffffffc50,
                              in_stack_fffffffffffffc48,(uchar *)in_stack_fffffffffffffc40,
                              (size_t)in_stack_fffffffffffffc38);
  if (local_224 == 0) {
    local_250 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffc30);
    local_250 = local_250 + 1;
    local_248 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffc30);
    local_248 = local_248 + 8;
    local_240 = local_248;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13f106);
    pvVar1 = local_240;
    do {
      local_240 = pvVar1;
      if (local_250 <= local_240 + 8 || local_240 < local_248) break;
      lodepng_chunk_type(local_275,local_240);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      lVar3 = std::__cxx11::string::size();
      std::__cxx11::string::~string(local_298);
      std::allocator<char>::~allocator(&local_299);
      if (lVar3 != 4) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      bVar2 = std::operator==(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      if (bVar2) {
        local_2d0 = lodepng_chunk_data_const(local_240);
        local_2d4 = lodepng_chunk_length((uchar *)0x13f2b8);
        if (((local_250 < local_240 + (ulong)local_2d4 + 0xc) ||
            (uVar4 = (ulong)local_2d4,
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18),
            sVar5 < uVar4)) || (local_240 + (ulong)local_2d4 + 0xc < local_248)) {
          local_4 = 1;
          local_238 = 1;
          goto LAB_0013f7d3;
        }
        for (local_2d8 = 0; local_2d8 < local_2d4; local_2d8 = local_2d8 + 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        }
      }
      local_270.custom_context = lodepng_chunk_next_const((uchar *)in_stack_fffffffffffffc28);
      pvVar1 = (uchar *)local_270.custom_context;
    } while (local_240 < local_270.custom_context);
    insize = &local_2f0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13f442);
    settings = &local_270;
    in = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)settings,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)settings);
    local_224 = decompress((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in,
                           (size_t)insize,settings);
    if (local_224 == 0) {
      if (local_150 == 0) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::resize(in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
        sVar6 = lodepng_get_raw_size
                          ((uint)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                           (uint)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        local_300 = 0;
        while (sVar5 = local_300,
              sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_2f0),
              sVar5 < sVar7) {
          in_stack_fffffffffffffc40 =
               (State *)std::
                        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::operator[](local_10,0);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                    (&local_2f0,local_300);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
          local_300 = sVar6 + 1 + local_300;
        }
      }
      else {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::resize(in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
        local_308 = (value_type_conflict1 *)0x0;
        for (local_310 = 0; local_310 < 7; local_310 = local_310 + 1) {
          local_318 = (((local_220 - getFilterTypesInterlaced::ADAM7_IY[local_310]) +
                       getFilterTypesInterlaced::ADAM7_DY[local_310]) - 1) /
                      getFilterTypesInterlaced::ADAM7_DY[local_310];
          if (local_220 <= getFilterTypesInterlaced::ADAM7_IY[local_310]) {
            local_318 = 0;
          }
          __x = (value_type_conflict1 *)
                lodepng_get_raw_size
                          ((uint)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                           (uint)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          pvVar8 = __x + 1;
          for (local_328 = 0; local_328 < local_318; local_328 = local_328 + 1) {
            in_stack_fffffffffffffc30 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](local_10,local_310);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (&local_2f0,(size_type)local_308);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffc40,__x);
            local_308 = pvVar8 + (long)local_308;
          }
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
    local_238 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc40);
LAB_0013f7d3:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc40);
  }
  else {
    local_4 = 1;
    local_238 = 1;
  }
  State::~State((State *)in_stack_fffffffffffffc30);
  return local_4;
}

Assistant:

unsigned getFilterTypesInterlaced(std::vector<std::vector<unsigned char> >& filterTypes,
                                  const std::vector<unsigned char>& png) {
  //Get color type and interlace type
  lodepng::State state;
  unsigned w, h;
  unsigned error;
  error = lodepng_inspect(&w, &h, &state, &png[0], png.size());

  if(error) return 1;

  //Read literal data from all IDAT chunks
  const unsigned char *chunk, *begin, *end, *next;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  std::vector<unsigned char> zdata;

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    if(std::string(type).size() != 4) break; //Probably not a PNG file

    if(std::string(type) == "IDAT") {
      const unsigned char* cdata = lodepng_chunk_data_const(chunk);
      unsigned clength = lodepng_chunk_length(chunk);
      if(chunk + clength + 12 > end || clength > png.size() || chunk + clength + 12 < begin) {
        // corrupt chunk length
        return 1;
      }

      for(unsigned i = 0; i < clength; i++) {
        zdata.push_back(cdata[i]);
      }
    }

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) break; // integer overflow
    chunk = next;
  }

  //Decompress all IDAT data (if the while loop ended early, this might fail)
  std::vector<unsigned char> data;
  error = lodepng::decompress(data, &zdata[0], zdata.size());

  if(error) return 1;

  if(state.info_png.interlace_method == 0) {
    filterTypes.resize(1);

    //A line is 1 filter byte + all pixels
    size_t linebytes = 1 + lodepng_get_raw_size(w, 1, &state.info_png.color);

    for(size_t i = 0; i < data.size(); i += linebytes) {
      filterTypes[0].push_back(data[i]);
    }
  } else {
    //Interlaced
    filterTypes.resize(7);
    static const unsigned ADAM7_IX[7] = { 0, 4, 0, 2, 0, 1, 0 }; /*x start values*/
    static const unsigned ADAM7_IY[7] = { 0, 0, 4, 0, 2, 0, 1 }; /*y start values*/
    static const unsigned ADAM7_DX[7] = { 8, 8, 4, 4, 2, 2, 1 }; /*x delta values*/
    static const unsigned ADAM7_DY[7] = { 8, 8, 8, 4, 4, 2, 2 }; /*y delta values*/
    size_t pos = 0;
    for(size_t j = 0; j < 7; j++) {
      unsigned w2 = (w - ADAM7_IX[j] + ADAM7_DX[j] - 1) / ADAM7_DX[j];
      unsigned h2 = (h - ADAM7_IY[j] + ADAM7_DY[j] - 1) / ADAM7_DY[j];
      if(ADAM7_IX[j] >= w) w2 = 0;
      if(ADAM7_IY[j] >= h) h2 = 0;
      size_t linebytes = 1 + lodepng_get_raw_size(w2, 1, &state.info_png.color);
      for(size_t i = 0; i < h2; i++) {
        filterTypes[j].push_back(data[pos]);
        pos += linebytes;
      }
    }
  }
  return 0; /* OK */
}